

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

void * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::reallocate
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr,
          size_type newUserSize)

{
  MemChunk *chunk;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  SmallMemChunk *curr;
  ulong uVar4;
  void *pvVar5;
  MemChunk *pMVar6;
  undefined4 *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  MemChunk *pMVar11;
  size_type *psVar12;
  
  if (ptr == (void *)0x0) {
    pvVar5 = allocate(this,newUserSize);
    return pvVar5;
  }
  uVar4 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffff0;
  uVar10 = uVar4;
  if ((*(ulong *)((long)ptr + -8) & 2) != 0) {
    lVar8 = (long)*(char *)((long)ptr + (uVar4 - 0x11));
    if (lVar8 < 1) {
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
      *puVar7 = 3;
      *(char **)(puVar7 + 2) = "Invalid padding byte value";
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar10 = uVar4 - lVar8;
  }
  uVar9 = 0x20;
  if (0xf < newUserSize) {
    uVar9 = newUserSize + 0x1f & 0xfffffffffffffff0;
  }
  if ((uVar10 + 0xf & 0xfffffffffffffff0) < uVar9) {
    pvVar5 = allocate(this,newUserSize);
    if (pvVar5 == (void *)0x0) {
      ptr = (void *)0x0;
    }
    else {
      memcpy(pvVar5,ptr,uVar10 - 0x10);
      deallocate(this,ptr,0);
      ptr = pvVar5;
    }
  }
  else {
    uVar10 = uVar4 - uVar9;
    if (0x1f < uVar10) {
      chunk = (MemChunk *)((long)ptr + (uVar9 - 0x10));
      *(ulong *)((long)ptr + -8) = uVar9;
      *(ulong *)((long)ptr + (uVar9 - 0x10)) = uVar9;
      *(ulong *)((long)ptr + (uVar9 - 8)) = uVar10;
      *(ulong *)((long)ptr + (uVar4 - 0x10)) = uVar10;
      if (uVar10 < 0x100) {
        pMVar6 = *(MemChunk **)((long)this + uVar10 + 0x30);
        if (pMVar6 == (MemChunk *)0x0) {
          psVar12 = (size_type *)((long)this + uVar10 + 0x30);
          pMVar6 = chunk;
          pMVar11 = chunk;
        }
        else {
          pMVar11 = (MemChunk *)pMVar6[1].m_prevFootSize;
          pMVar6[1].m_prevFootSize = (size_type)chunk;
          psVar12 = &pMVar11[1].m_size;
        }
        *psVar12 = (size_type)chunk;
        chunk[1].m_prevFootSize = (size_type)pMVar11;
        chunk[1].m_size = (size_type)pMVar6;
        if ((this->m_smallMap >> ((uint)(uVar10 >> 3) & 0x1f) & 1) == 0) {
          this->m_smallMap = this->m_smallMap | 1 << ((byte)(uVar10 >> 3) & 0x1f);
        }
      }
      else {
        addLargeChunk(this,chunk);
      }
    }
    bVar1 = this->m_storingExactSize;
    uVar10 = *(ulong *)((long)ptr + -8);
    uVar4 = uVar10 & 0xfffffffffffffff0;
    *(ulong *)((long)ptr + -8) = uVar10 | 1;
    if ((bVar1 == true) && (uVar4 != newUserSize + 0x10)) {
      *(ulong *)((long)ptr + -8) = uVar10 | 3;
      *(byte *)((long)ptr + (uVar4 - 0x11)) = ((byte)uVar10 & 0xf0) - (char)(newUserSize + 0x10);
    }
    *(ulong *)((long)ptr + (uVar4 - 0x10)) = uVar4 | 1;
    if ((this->m_padding == true) &&
       (bVar2 = (((byte)*(undefined4 *)((long)ptr + -8) & 0xf0) - (char)newUserSize) - 0x11,
       '\0' < (char)bVar2)) {
      bVar3 = 8;
      if (bVar2 < 8) {
        bVar3 = bVar2;
      }
      memset((void *)((long)ptr + newUserSize),(uint)(byte)this->m_paddingByte,(ulong)bVar3);
    }
  }
  return ptr;
}

Assistant:

T*
    reallocate (T* ptr, size_type newUserSize)
    {
        if (ptr == nullptr)
        {
            return allocate(newUserSize);
        }

        MemChunk* chunk = mem2Chunk (ptr);
        size_type oldAllocSize = chunk->getUserSize ();
        size_type oldChunkSize = calcChunkSize(oldAllocSize);

        size_type newAllocSize = newUserSize;
        size_type newChunkSize = (newAllocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize(newAllocSize);

        if (oldChunkSize < newChunkSize)
        {
            // For now we use a simple algorithm that allocate new memory.
            T* newPtr = allocate (newUserSize);
            if (newPtr)
            {
                memcpy(newPtr, ptr, oldAllocSize);
                deallocate (ptr);
            }
            return newPtr;
        }
        else
        {
            m_logger.logReallocation(ptr, oldAllocSize, newUserSize);

            // simply split the chunk
            splitChunk (chunk, newChunkSize);
            setUsed (chunk, newUserSize);
            return ptr;
        }
    }